

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O2

int Dar_RefactTryGraph(Aig_Man_t *pAig,Aig_Obj_t *pRoot,Vec_Ptr_t *vCut,Kit_Graph_t *pGraph,
                      int NodeMax,int LevelMax)

{
  Kit_Node_t *pKVar1;
  bool bVar2;
  bool bVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Aig_Obj_t *pAVar9;
  long lVar10;
  Aig_Obj_t *pFanin0;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  Aig_Obj_t *pFanin1;
  
  iVar12 = 0;
  if ((pGraph->fConst == 0) && ((uint)pGraph->nLeaves <= ((uint)pGraph->eRoot >> 1 & 0x3fffffff))) {
    lVar14 = 0x10;
    lVar13 = 0;
    while (lVar10 = (long)pGraph->nLeaves, lVar13 < lVar10) {
      pKVar1 = pGraph->pNodes;
      pvVar4 = Vec_PtrEntry(vCut,(int)lVar13);
      *(void **)((long)pKVar1 + lVar14 + -8) = pvVar4;
      *(uint *)(&(pKVar1->eEdge0).field_0x0 + lVar14) =
           *(uint *)(&(pKVar1->eEdge0).field_0x0 + lVar14) & 0xffffc000 |
           *(uint *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x1c) & 0x3fff;
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x18;
      if ((~*(ulong *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x18) & 0xffffff00000000) == 0) {
        __assert_fail("Aig_Regular((Aig_Obj_t *)pNode->pFunc)->Level < (1<<24)-1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darRefact.c"
                      ,0xf1,
                      "int Dar_RefactTryGraph(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Kit_Graph_t *, int, int)"
                     );
      }
    }
    lVar14 = lVar10 * 0x18 + 0x10;
    iVar12 = 0;
    for (; lVar10 < pGraph->nSize; lVar10 = lVar10 + 1) {
      pKVar1 = pGraph->pNodes;
      uVar11 = *(uint *)((long)pKVar1 + lVar14 + -0x10);
      uVar8 = *(uint *)((long)pKVar1 + lVar14 + -0xc);
      uVar6 = uVar11 >> 1 & 0x3fffffff;
      uVar7 = uVar8 >> 1 & 0x3fffffff;
      pFanin0 = (Aig_Obj_t *)pKVar1[uVar6].field_2.pFunc;
      pFanin1 = (Aig_Obj_t *)pKVar1[uVar7].field_2.pFunc;
      bVar3 = true;
      if ((pFanin0 == (Aig_Obj_t *)0x0) || (pFanin1 == (Aig_Obj_t *)0x0)) {
        pAVar5 = (Aig_Obj_t *)0x0;
LAB_003eafaf:
        bVar2 = bVar3;
        if (NodeMax <= iVar12) {
          return -1;
        }
        iVar12 = iVar12 + 1;
      }
      else {
        pFanin0 = (Aig_Obj_t *)((ulong)pFanin0 ^ (ulong)(uVar11 & 1));
        pFanin1 = (Aig_Obj_t *)((ulong)pFanin1 ^ (ulong)(uVar8 & 1));
        pAVar5 = Aig_TableLookupTwo(pAig,pFanin0,pFanin1);
        if ((Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe) == pRoot) {
          return -1;
        }
        if (pAVar5 == (Aig_Obj_t *)0x0) {
          pAVar5 = (Aig_Obj_t *)0x0;
          goto LAB_003eafaf;
        }
        bVar2 = false;
        bVar3 = false;
        if (((Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe))->TravId == pAig->nTravIds)
        goto LAB_003eafaf;
      }
      uVar8 = *(uint *)&pKVar1[uVar6].field_0x10 & 0x3fff;
      uVar11 = *(uint *)&pKVar1[uVar7].field_0x10 & 0x3fff;
      if (uVar11 < uVar8) {
        uVar11 = uVar8;
      }
      uVar11 = uVar11 + 1;
      if (!bVar2) {
        pAVar9 = (Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe);
        if (pAig->pConst1 == pAVar9) {
          uVar11 = 0;
        }
        else if ((pAVar9 == (Aig_Obj_t *)((ulong)pFanin0 & 0xfffffffffffffffe)) ||
                (pAVar9 == (Aig_Obj_t *)((ulong)pFanin1 & 0xfffffffffffffffe))) {
          uVar11 = *(uint *)&pAVar9->field_0x1c & 0xffffff;
        }
      }
      if (LevelMax < (int)uVar11) {
        return -1;
      }
      *(Aig_Obj_t **)((long)pKVar1 + lVar14 + -8) = pAVar5;
      *(uint *)(&(pKVar1->eEdge0).field_0x0 + lVar14) =
           *(uint *)(&(pKVar1->eEdge0).field_0x0 + lVar14) & 0xffffc000 | uVar11 & 0x3fff;
      lVar14 = lVar14 + 0x18;
    }
  }
  return iVar12;
}

Assistant:

int Dar_RefactTryGraph( Aig_Man_t * pAig, Aig_Obj_t * pRoot, Vec_Ptr_t * vCut, Kit_Graph_t * pGraph, int NodeMax, int LevelMax )
{
    Kit_Node_t * pNode, * pNode0, * pNode1;
    Aig_Obj_t * pAnd, * pAnd0, * pAnd1;
    int i, Counter, LevelNew, LevelOld;
    // check for constant function or a literal
    if ( Kit_GraphIsConst(pGraph) || Kit_GraphIsVar(pGraph) )
        return 0;
    // set the levels of the leaves
    Kit_GraphForEachLeaf( pGraph, pNode, i )
    {
        pNode->pFunc = Vec_PtrEntry(vCut, i);
        pNode->Level = Aig_Regular((Aig_Obj_t *)pNode->pFunc)->Level;
        assert( Aig_Regular((Aig_Obj_t *)pNode->pFunc)->Level < (1<<24)-1 );
    }
//printf( "Trying:\n" );
    // compute the AIG size after adding the internal nodes
    Counter = 0;
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        // get the children of this node
        pNode0 = Kit_GraphNode( pGraph, pNode->eEdge0.Node );
        pNode1 = Kit_GraphNode( pGraph, pNode->eEdge1.Node );
        // get the AIG nodes corresponding to the children 
        pAnd0 = (Aig_Obj_t *)pNode0->pFunc; 
        pAnd1 = (Aig_Obj_t *)pNode1->pFunc; 
        if ( pAnd0 && pAnd1 )
        {
            // if they are both present, find the resulting node
            pAnd0 = Aig_NotCond( pAnd0, pNode->eEdge0.fCompl );
            pAnd1 = Aig_NotCond( pAnd1, pNode->eEdge1.fCompl );
            pAnd  = Aig_TableLookupTwo( pAig, pAnd0, pAnd1 );
            // return -1 if the node is the same as the original root
            if ( Aig_Regular(pAnd) == pRoot )
                return -1;
        }
        else
            pAnd = NULL;
        // count the number of added nodes
        if ( pAnd == NULL || Aig_ObjIsTravIdCurrent(pAig, Aig_Regular(pAnd)) )
        {
            if ( ++Counter > NodeMax )
                return -1;
        }
        // count the number of new levels
        LevelNew = 1 + Abc_MaxInt( pNode0->Level, pNode1->Level );
        if ( pAnd )
        {
            if ( Aig_Regular(pAnd) == Aig_ManConst1(pAig) )
                LevelNew = 0;
            else if ( Aig_Regular(pAnd) == Aig_Regular(pAnd0) )
                LevelNew = (int)Aig_Regular(pAnd0)->Level;
            else if ( Aig_Regular(pAnd) == Aig_Regular(pAnd1) )
                LevelNew = (int)Aig_Regular(pAnd1)->Level;
            LevelOld = (int)Aig_Regular(pAnd)->Level;
//            assert( LevelNew == LevelOld );
        }
        if ( LevelNew > LevelMax )
            return -1;
        pNode->pFunc = pAnd;
        pNode->Level = LevelNew;
/*
printf( "Checking " );
Ref_ObjPrint( pAnd0 );
printf( " and " );
Ref_ObjPrint( pAnd1 );
printf( "  Result " );
Ref_ObjPrint( pNode->pFunc );
printf( "\n" );
*/
    }
    return Counter;
}